

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageOptions::MergePartialFromCodedStream
          (MessageOptions *this,CodedInputStream *input)

{
  Message *containing_type;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  UninterpretedOption *value;
  UnknownFieldSet *pUVar5;
  uint32 tag;
  CodedInputStream *input_local;
  MessageOptions *this_local;
  uint32 local_70;
  uint32 local_3c;
  bool *pbStack_38;
  uint32 temp_1;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  bool *pbStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_70 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_70 = input->last_tag_;
      }
      if (local_70 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_70);
      if (iVar3 == 1) break;
      if (iVar3 == 2) {
        WVar4 = internal::WireFormatLite::GetTagWireType(local_70);
        if (WVar4 == WIRETYPE_VARINT) goto LAB_0030119d;
      }
      else if ((iVar3 == 999) &&
              (WVar4 = internal::WireFormatLite::GetTagWireType(local_70),
              WVar4 == WIRETYPE_LENGTH_DELIMITED)) goto LAB_00301312;
LAB_0030146b:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_70);
      containing_type = default_instance_;
      if (WVar4 == WIRETYPE_END_GROUP) {
        return true;
      }
      if (local_70 < 8000) {
        pUVar5 = mutable_unknown_fields(this);
        bVar1 = internal::WireFormat::SkipField(input,local_70,pUVar5);
        if (!bVar1) {
          return false;
        }
      }
      else {
        pUVar5 = mutable_unknown_fields(this);
        bVar1 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,local_70,input,containing_type,pUVar5);
        if (!bVar1) {
          return false;
        }
      }
    }
    WVar4 = internal::WireFormatLite::GetTagWireType(local_70);
    if (WVar4 != WIRETYPE_VARINT) goto LAB_0030146b;
    pbStack_20 = &this->message_set_wire_format_;
    local_18 = input;
    local_9 = io::CodedInputStream::ReadVarint32(input,&local_24);
    if (!(bool)local_9) {
      return false;
    }
    *pbStack_20 = local_24 != 0;
    set_has_message_set_wire_format(this);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x10')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_0030119d:
      pbStack_38 = &this->no_standard_descriptor_accessor_;
      local_30 = input;
      local_25 = io::CodedInputStream::ReadVarint32(input,&local_3c);
      if (!(bool)local_25) {
        return false;
      }
      *pbStack_38 = local_3c != 0;
      set_has_no_standard_descriptor_accessor(this);
      iVar3 = io::CodedInputStream::BufferSize(input);
      if (((iVar3 < 2) || (*input->buffer_ != 0xba)) || (input->buffer_[1] != '>')) {
        bVar1 = false;
      }
      else {
        io::CodedInputStream::Advance(input,2);
        bVar1 = true;
      }
      if (bVar1) {
LAB_00301312:
        do {
          value = add_uninterpreted_option(this);
          bVar1 = internal::WireFormatLite::
                  ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(input,value);
          if (!bVar1) {
            return false;
          }
          iVar3 = io::CodedInputStream::BufferSize(input);
          if (((iVar3 < 2) || (*input->buffer_ != 0xba)) || (input->buffer_[1] != '>')) {
            bVar1 = false;
          }
          else {
            io::CodedInputStream::Advance(input,2);
            bVar1 = true;
          }
        } while (bVar1);
        bVar1 = io::CodedInputStream::ExpectAtEnd(input);
        if (bVar1) {
          return true;
        }
      }
    }
  } while( true );
}

Assistant:

bool MessageOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &message_set_wire_format_)));
          set_has_message_set_wire_format();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_no_standard_descriptor_accessor;
        break;
      }

      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_no_standard_descriptor_accessor:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &no_standard_descriptor_accessor_)));
          set_has_no_standard_descriptor_accessor();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}